

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

Test * __thiscall ObjTable<Test>::emplace_back_large<int&>(ObjTable<Test> *this,int *args)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  pointer ppVar5;
  reference pvVar6;
  unsigned_long local_58;
  _Self local_28;
  iterator end;
  iterator it;
  int *args_local;
  ObjTable<Test> *this_local;
  
  end = std::
        map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
        ::begin(&this->sparse_elements);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Test,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Test>_>_>
       ::end(&this->sparse_elements);
  while( true ) {
    bVar2 = std::operator!=(&end,&local_28);
    bVar3 = false;
    if (bVar2) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
      uVar1 = ppVar5->first;
      sVar4 = std::vector<Test,_std::allocator<Test>_>::size
                        (&this->super_vector<Test,_std::allocator<Test>_>);
      bVar3 = uVar1 == sVar4;
    }
    if (!bVar3) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
    std::vector<Test,_std::allocator<Test>_>::emplace_back<Test>
              (&this->super_vector<Test,_std::allocator<Test>_>,&ppVar5->second);
    end = std::
          map<unsigned_long,Test,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
          ::erase_abi_cxx11_((map<unsigned_long,Test,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                              *)&this->sparse_elements,end);
  }
  bVar3 = std::operator==(&end,&local_28);
  if (bVar3) {
    local_58 = std::numeric_limits<unsigned_long>::max();
  }
  else {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Test>_>::operator->(&end);
    local_58 = ppVar5->first;
  }
  this->min_sparse = local_58;
  pvVar6 = std::vector<Test,std::allocator<Test>>::emplace_back<int&>
                     ((vector<Test,std::allocator<Test>> *)this,args);
  return pvVar6;
}

Assistant:

T&
    emplace_back_large(Args&&... args)
    {
        auto it = sparse_elements.begin();
        auto end = sparse_elements.end();
        while (it != end && it->first == std::vector<T>::size()) {
            std::vector<T>::emplace_back(std::move(it->second));
            it = sparse_elements.erase(it);
        }
        min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        return std::vector<T>::emplace_back(std::forward<Args&&...>(args...));
    }